

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-entry-renderers.c
# Opt level: O2

wchar_t ui_entry_renderer_customize(wchar_t ind,char *colors,char *label_colors,char *symbols)

{
  wchar_t wVar1;
  size_t sVar2;
  wchar_t *dest;
  size_t sVar3;
  uint uVar4;
  
  wVar1 = L'\x01';
  if ((L'\0' < ind) && (ind <= renderer_count)) {
    if (colors != (char *)0x0) {
      sVar2 = strlen(colors);
      wVar1 = (wchar_t)sVar2;
      if ((ulong)(long)renderers[(uint)(ind + L'\xffffffff')].ncolors <= sVar2) {
        wVar1 = renderers[(uint)(ind + L'\xffffffff')].ncolors;
      }
      convert_chars_to_attrs(colors,wVar1,renderers[(uint)(ind + L'\xffffffff')].colors);
    }
    if (label_colors != (char *)0x0) {
      sVar2 = strlen(label_colors);
      wVar1 = (wchar_t)sVar2;
      if ((ulong)(long)renderers[(uint)(ind + L'\xffffffff')].ncolors <= sVar2) {
        wVar1 = renderers[(uint)(ind + L'\xffffffff')].ncolors;
      }
      convert_chars_to_attrs(label_colors,wVar1,renderers[(uint)(ind + L'\xffffffff')].label_colors)
      ;
    }
    if (symbols != (char *)0x0) {
      uVar4 = ind + L'\xffffffff';
      dest = (wchar_t *)mem_alloc((long)renderers[uVar4].nsym * 4 + 4);
      sVar3 = text_mbstowcs(dest,symbols,renderers[uVar4].nsym + L'\x01');
      if (sVar3 == 0xffffffffffffffff) {
        return L'\x01';
      }
      wVar1 = (wchar_t)sVar3;
      if (renderers[uVar4].nsym < (wchar_t)sVar3) {
        wVar1 = renderers[uVar4].nsym;
      }
      memcpy(renderers[uVar4].symbols,dest,(long)wVar1 << 2);
      mem_free(dest);
    }
    wVar1 = L'\0';
  }
  return wVar1;
}

Assistant:

int ui_entry_renderer_customize(int ind, const char *colors,
	const char *label_colors, const char *symbols)
{
	size_t length;

	if (ind <= 0 || ind > renderer_count) {
		return 1;
	}
	if (colors != 0) {
		length = strlen(colors);
		convert_chars_to_attrs(colors,
			(length < (size_t) renderers[ind - 1].ncolors) ?
			(int) length : renderers[ind - 1].ncolors,
			renderers[ind - 1].colors);
	}
	if (label_colors != 0) {
		length = strlen(label_colors);
		convert_chars_to_attrs(label_colors,
			(length < (size_t) renderers[ind - 1].ncolors) ?
			(int) length : renderers[ind - 1].ncolors,
			renderers[ind - 1].label_colors);
	}
	if (symbols != 0) {
		wchar_t *tmp = mem_alloc((renderers[ind - 1].nsym + 1) *
			sizeof(*tmp));

		length = text_mbstowcs(tmp, symbols,
			renderers[ind - 1].nsym + 1);
		if (length == (size_t)-1) {
			return 1;
		}
		(void) memcpy(renderers[ind - 1].symbols, tmp,
			(((int)length < renderers[ind - 1].nsym) ?
			(int)length : renderers[ind - 1].nsym) *
			sizeof(*renderers[ind - 1].symbols));
		mem_free(tmp);
	}
	return 0;
}